

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O2

Utest * __thiscall
TEST_DoublingFactorCounterTest_AllTriplets_TestShell::createTest
          (TEST_DoublingFactorCounterTest_AllTriplets_TestShell *this)

{
  TEST_DoublingFactorCounterTest_AllTriplets_Test *this_00;
  
  this_00 = (TEST_DoublingFactorCounterTest_AllTriplets_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                         ,0x13a);
  TEST_DoublingFactorCounterTest_AllTriplets_Test::TEST_DoublingFactorCounterTest_AllTriplets_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, AllTriplets)
{
	addPair(Tile::WestWind);
	addTriplet(Tile::OneOfCharacters, true);
	addTriplet(Tile::TwoOfCircles, true);
	addTriplet(Tile::ThreeOfBamboos, false);
	addTriplet(Tile::SevenOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::AllTriplets));
	CHECK_EQUAL(2, r.doubling_factor);
}